

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

RelationalKind mathiu::impl::invertRelational(RelationalKind relKind)

{
  logic_error *this;
  runtime_error *this_00;
  RelationalKind local_c;
  RelationalKind relKind_local;
  
  switch(relKind) {
  case kEQUAL:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unsupported relational : == in invertRelational!");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case kLESS:
    local_c = kGREATER;
    break;
  case kLESS_EQUAL:
    local_c = kGREATER_EQUAL;
    break;
  case kGREATER:
    local_c = kLESS;
    break;
  case kGREATER_EQUAL:
    local_c = kLESS_EQUAL;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Missing case!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_c;
}

Assistant:

auto invertRelational(RelationalKind relKind) -> RelationalKind
    {
        switch (relKind)
        {
        case RelationalKind::kLESS:
            return RelationalKind::kGREATER;
        case RelationalKind::kLESS_EQUAL:
            return RelationalKind::kGREATER_EQUAL;
        case RelationalKind::kGREATER_EQUAL:
            return RelationalKind::kLESS_EQUAL;
        case RelationalKind::kGREATER:
            return RelationalKind::kLESS;
        case RelationalKind::kEQUAL:
            throw std::logic_error{"Unsupported relational : == in invertRelational!"};
        }
        throw std::runtime_error("Missing case!");
    }